

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>,_bool>
* __thiscall
google::protobuf::Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>
::InnerMap::insert<std::__cxx11::string_const&>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>,_bool>
           *__return_storage_ptr__,InnerMap *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  bool bVar1;
  Node *ptr;
  Arena *pAVar2;
  CustomModel_CustomModelParamValue *ptr_00;
  bool local_a1;
  undefined1 local_a0 [8];
  iterator result;
  Node *node;
  size_type b;
  bool local_51;
  iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
  local_50;
  undefined1 local_38 [8];
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>,_unsigned_long>
  p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  InnerMap *this_local;
  
  p.second = (unsigned_long)k;
  FindHelper<std::__cxx11::string>
            ((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>,_unsigned_long>
              *)local_38,this,k);
  if (local_38 == (undefined1  [8])0x0) {
    bVar1 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
            ::InnerMap::ResizeIfLoadIsOutOfRange((InnerMap *)this,*(long *)this + 1);
    if (bVar1) {
      FindHelper<std::__cxx11::string>
                ((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>,_unsigned_long>
                  *)&b,this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p.second);
      std::
      pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>,_unsigned_long>
      ::operator=((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>,_unsigned_long>
                   *)local_38,(type)&b);
    }
    ptr = Alloc<google::protobuf::Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::Node>
                    (this,1);
    result.bucket_index_ = (size_type)ptr;
    pAVar2 = internal::MapAllocator<void_*>::arena((MapAllocator<void_*> *)(this + 0x28));
    Arena::CreateInArenaStorage<std::__cxx11::string,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ptr,pAVar2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p.second);
    ptr_00 = (CustomModel_CustomModelParamValue *)(result.bucket_index_ + 0x20);
    pAVar2 = internal::MapAllocator<void_*>::arena((MapAllocator<void_*> *)(this + 0x28));
    Arena::CreateInArenaStorage<CoreML::Specification::CustomModel_CustomModelParamValue>
              (ptr_00,pAVar2);
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
    ::InnerMap::InsertUnique
              ((iterator *)local_a0,(InnerMap *)this,p.first.bucket_index_,
               (Node *)result.bucket_index_);
    *(long *)this = *(long *)this + 1;
    local_a1 = true;
    std::
    make_pair<google::protobuf::Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>>&,bool>
              (__return_storage_ptr__,
               (iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
                *)local_a0,&local_a1);
  }
  else {
    iterator_base<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>>
    ::
    iterator_base<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>const>
              ((iterator_base<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>>
                *)&local_50,
               (iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
                *)local_38);
    local_51 = false;
    std::
    make_pair<google::protobuf::Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>>,bool>
              (__return_storage_ptr__,&local_50,&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(K&& k) {
      std::pair<const_iterator, size_type> p = FindHelper(k);
      // Case 1: key was already present.
      if (p.first.node_ != nullptr)
        return std::make_pair(iterator(p.first), false);
      // Case 2: insert.
      if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
        p = FindHelper(k);
      }
      const size_type b = p.second;  // bucket number
      // If K is not key_type, make the conversion to key_type explicit.
      using TypeToInit = typename std::conditional<
          std::is_same<typename std::decay<K>::type, key_type>::value, K&&,
          key_type>::type;
      Node* node = Alloc<Node>(1);
      // Even when arena is nullptr, CreateInArenaStorage is still used to
      // ensure the arena of submessage will be consistent. Otherwise,
      // submessage may have its own arena when message-owned arena is enabled.
      Arena::CreateInArenaStorage(const_cast<Key*>(&node->kv.first),
                                  alloc_.arena(),
                                  static_cast<TypeToInit>(std::forward<K>(k)));
      Arena::CreateInArenaStorage(&node->kv.second, alloc_.arena());

      iterator result = InsertUnique(b, node);
      ++num_elements_;
      return std::make_pair(result, true);
    }